

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O1

void __thiscall
agg::pod_bvector<agg::point_base<double>,_6U>::add
          (pod_bvector<agg::point_base<double>,_6U> *this,point_base<double> *val)

{
  double *pdVar1;
  double dVar2;
  uint nb;
  
  nb = this->m_size >> 6;
  if (this->m_num_blocks <= nb) {
    allocate_block(this,nb);
  }
  dVar2 = val->y;
  pdVar1 = (double *)((long)&this->m_blocks[nb]->x + (ulong)((this->m_size & 0x3f) << 4));
  *pdVar1 = val->x;
  pdVar1[1] = dVar2;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void pod_bvector<T, S>::add(const T& val)
    {
        *data_ptr() = val;
        ++m_size;
    }